

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

char_t * __thiscall
pugi::impl::anon_unknown_0::xpath_parser::alloc_string(xpath_parser *this,xpath_lexer_string *value)

{
  size_t __n;
  char_t *c;
  size_t length;
  xpath_lexer_string *value_local;
  xpath_parser *this_local;
  
  if (value->begin == (char_t *)0x0) {
    this_local = (xpath_parser *)0x2dd03e;
  }
  else {
    __n = (long)value->end - (long)value->begin;
    this_local = (xpath_parser *)xpath_allocator::allocate(this->_alloc,__n + 1);
    if (this_local == (xpath_parser *)0x0) {
      this_local = (xpath_parser *)0x0;
    }
    else {
      memcpy(this_local,value->begin,__n);
      *(undefined1 *)((long)this_local + __n) = 0;
    }
  }
  return (char_t *)this_local;
}

Assistant:

const char_t* alloc_string(const xpath_lexer_string& value)
		{
			if (!value.begin)
				return PUGIXML_TEXT("");

			size_t length = static_cast<size_t>(value.end - value.begin);

			char_t* c = static_cast<char_t*>(_alloc->allocate((length + 1) * sizeof(char_t)));
			if (!c) return NULL;

			memcpy(c, value.begin, length * sizeof(char_t));
			c[length] = 0;

			return c;
		}